

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O2

void __thiscall
CUI::DoEditBoxOption(CUI *this,CLineInput *pLineInput,CUIRect *pRect,char *pStr,float VSplitVal)

{
  long lVar1;
  long in_FS_OFFSET;
  float FontSize;
  CUIRect EditBox;
  CUIRect Label;
  char aBuf [32];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  aBuf[0] = '\0';
  aBuf[1] = '\0';
  aBuf[2] = '\0';
  aBuf[3] = '\0';
  aBuf[4] = '\0';
  aBuf[5] = '\0';
  aBuf[6] = '\0';
  aBuf[7] = '\0';
  aBuf[8] = '\0';
  aBuf[9] = '\0';
  aBuf[10] = '\0';
  aBuf[0xb] = '\0';
  aBuf[0xc] = '\0';
  aBuf[0xd] = '\0';
  aBuf[0xe] = -0x80;
  aBuf[0xf] = '>';
  CUIRect::Draw(pRect,(vec4 *)aBuf,5.0,0xf);
  CUIRect::VSplitLeft(pRect,VSplitVal,&Label,&EditBox);
  FontSize = pRect->h * 0.8 * 0.8;
  str_format(aBuf,0x20,"%s:",pStr);
  DoLabel(this,&Label,aBuf,FontSize,5,-1.0,true);
  DoEditBox(this,pLineInput,&EditBox,FontSize,0xf,
            &DarkButtonColorFunction.super_IButtonColorFunction);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CUI::DoEditBoxOption(CLineInput *pLineInput, const CUIRect *pRect, const char *pStr, float VSplitVal)
{
	pRect->Draw(vec4(0.0f, 0.0f, 0.0f, 0.25f));

	CUIRect Label, EditBox;
	pRect->VSplitLeft(VSplitVal, &Label, &EditBox);

	const float FontSize = pRect->h*CUI::ms_FontmodHeight*0.8f;
	char aBuf[32];
	str_format(aBuf, sizeof(aBuf), "%s:", pStr);
	DoLabel(&Label, aBuf, FontSize, TEXTALIGN_MC);

	DoEditBox(pLineInput, &EditBox, FontSize);
}